

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_oblyp_d.c
# Opt level: O1

void gga_xc_opwlyp_d_init(xc_func_type *p)

{
  xc_mix_init(p,2,gga_xc_opwlyp_d_init::funcs_id,gga_xc_opwlyp_d_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,gga_xc_opwlyp_d_init::par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1],gga_xc_opwlyp_d_init::par_c_lyp);
  return;
}

Assistant:

static void
gga_xc_opwlyp_d_init(xc_func_type *p)
{
  static int    funcs_id  [4] = {XC_GGA_X_MPW91, XC_GGA_C_LYP};
  static double funcs_coef[4] = {1.0, 1.0};

  static double par_c_lyp[] = {0.04960, 0.144, 0.2262, 0.346};
  static double par_x_pw91[] = {0.00402, 0.8894/(X2S*X2S), 0.79};

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_func_set_ext_params(p->func_aux[0], par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1], par_c_lyp);
}